

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O1

void leccalc::checkinputfile(uint *samplesize,FILE *fin,aggreports *agg)

{
  size_t sVar1;
  char *pcVar2;
  ostream *poVar3;
  uint stream_type;
  uint summaryset_id;
  uint local_20;
  undefined1 local_1c [4];
  
  local_20 = 0;
  sVar1 = fread(&local_20,4,1,(FILE *)fin);
  if ((sVar1 == 1) && ((~local_20 & 0x3000000) == 0)) {
    sVar1 = fread(samplesize,4,1,(FILE *)fin);
    if (sVar1 == 1) {
      sVar1 = fread(local_1c,4,1,(FILE *)fin);
      if (sVar1 == 1) {
        if (checkinputfile::firstFileRead == false) {
          aggreports::SetSampleSize(agg,*samplesize);
          checkinputfile::firstFileRead = true;
        }
        return;
      }
      poVar3 = (ostream *)&std::cerr;
      pcVar2 = "FATAL: Stream read error: summaryset_id\n";
    }
    else {
      poVar3 = (ostream *)&std::cerr;
      pcVar2 = "FATAL: Stream read error: samplesize\n";
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "FATAL:: Not a summarycalc stream invalid stream type: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
    pcVar2 = "\n";
  }
  std::operator<<(poVar3,pcVar2);
  exit(-1);
}

Assistant:

inline void checkinputfile(unsigned int& samplesize, FILE * fin,
				   aggreports &agg)
	{
		static bool firstFileRead = false;

		// read_stream_type()
		unsigned int stream_type = 0;
		size_t i = fread(&stream_type, sizeof(stream_type), 1, fin);
		if (i != 1 || isSummaryCalcStream(stream_type) != true) {
			std::cerr << "FATAL:: Not a summarycalc stream invalid stream type: " << stream_type << "\n";
			exit(-1);
		}

		// read_sample_size()
		i = fread(&samplesize, sizeof(samplesize), 1, fin);
		if (i != 1) {
			std::cerr << "FATAL: Stream read error: samplesize\n";
			exit(-1);
		}

		// read_summary_set_id()
		unsigned int summaryset_id;
		i = fread(&summaryset_id, sizeof(summaryset_id), 1, fin);
		if (i != 1) {
			std::cerr << "FATAL: Stream read error: summaryset_id\n";
			exit(-1);
		}

		if (firstFileRead) return;

		agg.SetSampleSize(samplesize);   // Extract sample size from first file
		firstFileRead = true;
	}